

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

void google::AddLogSink(LogSink *destination)

{
  _Head_base<0UL,_std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_*,_false> __p;
  _Head_base<0UL,_std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_*,_false>
  _Stack_18;
  LogSink *pLStack_10;
  
  pLStack_10 = destination;
  std::__shared_mutex_pthread::lock((__shared_mutex_pthread *)LogDestination::sink_mutex_);
  if (LogDestination::sinks_ == (vector<google::LogSink_*,_std::allocator<google::LogSink_*>_> *)0x0
     ) {
    std::make_unique<std::vector<google::LogSink*,std::allocator<google::LogSink*>>>();
    __p._M_head_impl = _Stack_18._M_head_impl;
    _Stack_18._M_head_impl = (pointer)0x0;
    std::
    __uniq_ptr_impl<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
    ::reset((__uniq_ptr_impl<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
             *)&LogDestination::sinks_,__p._M_head_impl);
    std::
    unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>,_std::default_delete<std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>_>_>
                   *)&_Stack_18);
  }
  std::vector<google::LogSink_*,_std::allocator<google::LogSink_*>_>::push_back
            (LogDestination::sinks_,&pLStack_10);
  pthread_rwlock_unlock((pthread_rwlock_t *)LogDestination::sink_mutex_);
  return;
}

Assistant:

void AddLogSink(LogSink* destination) {
  LogDestination::AddLogSink(destination);
}